

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall
backend::codegen::RegAllocator::RegAllocator
          (RegAllocator *this,Function *f,ColorMap *color_map,
          map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
          *mir_to_arm)

{
  _Rb_tree_header *p_Var1;
  
  this->f = f;
  this->color_map = color_map;
  this->mir_to_arm = mir_to_arm;
  p_Var1 = &(this->used_regs)._M_t._M_impl.super__Rb_tree_header;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->used_regs)._M_t._M_impl = 0;
  *(undefined8 *)&(this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_regs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->used_regs_temp)._M_t._M_impl = 0;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bb_used_regs)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->bb_used_regs)._M_h._M_bucket_count = 0;
  (this->bb_used_regs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_used_regs)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->bb_used_regs)._M_h._M_rehash_policy = 0;
  (this->bb_used_regs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_used_regs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bb_used_regs)._M_h._M_buckets = &(this->bb_used_regs)._M_h._M_single_bucket;
  (this->bb_used_regs)._M_h._M_bucket_count = 1;
  (this->bb_used_regs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_used_regs)._M_h._M_element_count = 0;
  (this->bb_used_regs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->point_bb_map)._M_t._M_impl.super__Rb_tree_header;
  (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->live_intervals)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->live_intervals)._M_h._M_bucket_count = 0;
  (this->live_intervals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->live_intervals)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->live_intervals)._M_h._M_rehash_policy = 0;
  (this->live_intervals)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->live_intervals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->live_intervals)._M_h._M_buckets = &(this->live_intervals)._M_h._M_single_bucket;
  (this->live_intervals)._M_h._M_bucket_count = 1;
  (this->live_intervals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->live_intervals)._M_h._M_element_count = 0;
  (this->live_intervals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reg_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->reg_map)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->reg_map)._M_h._M_rehash_policy = 0;
  (this->reg_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reg_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reg_map)._M_h._M_element_count = 0;
  (this->reg_map)._M_h._M_buckets = &(this->reg_map)._M_h._M_single_bucket;
  (this->reg_map)._M_h._M_bucket_count = 1;
  (this->reg_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reg_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reg_reverse_map)._M_h._M_buckets = &(this->reg_reverse_map)._M_h._M_single_bucket;
  (this->reg_reverse_map)._M_h._M_bucket_count = 1;
  (this->reg_reverse_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reg_reverse_map)._M_h._M_element_count = 0;
  (this->reg_reverse_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reg_reverse_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_reverse_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->active)._M_h._M_buckets = &(this->active)._M_h._M_single_bucket;
  (this->active)._M_h._M_bucket_count = 1;
  (this->active)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active)._M_h._M_element_count = 0;
  (this->active)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->active_reg_map).
  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->active_reg_map;
  (this->active_reg_map).
  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->active_reg_map;
  (this->spilled_regs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spilled_regs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->spilled_regs)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->spilled_regs)._M_h._M_rehash_policy = 0;
  (this->spilled_regs)._M_h._M_bucket_count = 0;
  (this->spilled_regs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_reg_map).
  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->spilled_regs)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->spilled_regs)._M_h._M_buckets = &(this->spilled_regs)._M_h._M_single_bucket;
  (this->spilled_regs)._M_h._M_bucket_count = 1;
  (this->spilled_regs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spilled_regs)._M_h._M_element_count = 0;
  (this->spilled_regs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spill_positions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->spill_positions)._M_h._M_rehash_policy = 0;
  (this->spill_positions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spill_positions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spill_positions)._M_h._M_element_count = 0;
  (this->spill_positions)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->spill_positions)._M_h._M_bucket_count = 0;
  (this->spilled_regs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spilled_regs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->spill_positions)._M_h._M_buckets = &(this->spill_positions)._M_h._M_single_bucket;
  (this->spill_positions)._M_h._M_bucket_count = 1;
  (this->spill_positions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spill_positions)._M_h._M_element_count = 0;
  (this->spill_positions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spill_positions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spill_positions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->spilled_cross_block_reg)._M_h._M_buckets =
       &(this->spilled_cross_block_reg)._M_h._M_single_bucket;
  (this->spilled_cross_block_reg)._M_h._M_bucket_count = 1;
  (this->spilled_cross_block_reg)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spilled_cross_block_reg)._M_h._M_element_count = 0;
  (this->spilled_cross_block_reg)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spilled_cross_block_reg)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spilled_cross_block_reg)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reg_assign_count)._M_h._M_buckets = &(this->reg_assign_count)._M_h._M_single_bucket;
  (this->reg_assign_count)._M_h._M_bucket_count = 1;
  (this->reg_assign_count)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reg_assign_count)._M_h._M_element_count = 0;
  (this->reg_assign_count)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reg_assign_count)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_assign_count)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reg_affine)._M_h._M_buckets = &(this->reg_affine)._M_h._M_single_bucket;
  (this->reg_affine)._M_h._M_bucket_count = 1;
  (this->reg_affine)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reg_affine)._M_h._M_element_count = 0;
  (this->reg_affine)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reg_affine)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_affine)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reg_collapse)._M_h._M_buckets = &(this->reg_collapse)._M_h._M_single_bucket;
  (this->reg_collapse)._M_h._M_bucket_count = 1;
  (this->reg_collapse)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reg_collapse)._M_h._M_element_count = 0;
  (this->reg_collapse)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->bl_points)._M_t._M_impl.super__Rb_tree_header;
  (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reg_collapse)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reg_collapse)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->wrote_to)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->wrote_to)._M_h._M_bucket_count = 0;
  (this->wrote_to)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->wrote_to)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->wrote_to)._M_h._M_rehash_policy = 0;
  (this->wrote_to)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->wrote_to)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->wrote_to)._M_h._M_buckets = &(this->wrote_to)._M_h._M_single_bucket;
  (this->wrote_to)._M_h._M_bucket_count = 1;
  (this->wrote_to)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->wrote_to)._M_h._M_element_count = 0;
  (this->wrote_to)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->write_back_regs)._M_t._M_impl.super__Rb_tree_header;
  (this->write_back_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->write_back_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->write_back_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->write_back_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->write_back_regs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->stack_size = f->stack_size;
  this->stack_offset = 0;
  (this->delayed_store).super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = false
  ;
  this->bb_reset = true;
  this->is_leaf_func = true;
  this->cur_cond = Always;
  return;
}

Assistant:

RegAllocator(arm::Function &f, ColorMap &color_map,
               std::map<mir::inst::VarId, Reg> &mir_to_arm)
      : f(f),
        live_intervals(),
        reg_map(),
        stack_size(f.stack_size),
        spilled_regs(),
        spill_positions(),
        color_map(color_map),
        mir_to_arm(mir_to_arm),
        bb_used_regs(),
        inst_sink() {}